

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::computeMLResidual(MLMG *this,int amrlevmax)

{
  pointer pAVar1;
  pointer pVVar2;
  pointer pAVar3;
  bool bVar4;
  int alev;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (-1 < amrlevmax) {
    uVar7 = (ulong)(uint)amrlevmax;
    lVar8 = uVar7 * 8;
    lVar6 = uVar7 * 0x18;
    do {
      pAVar1 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)&pAVar1[-1].m_ptr._M_t.
                     super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                     .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl + lVar8;
      if (lVar8 == 0) {
        lVar5 = 0;
      }
      (*this->linop->_vptr_MLLinOp[0x34])
                (this->linop,uVar7 & 0xffffffff,
                 *(undefined8 *)
                  ((long)&(((this->res).
                            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar6),
                 (long)&(pAVar1->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar8,(long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                                super__Vector_impl_data._M_start)->m_ptr)._M_t.
                              super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl
                       + lVar8,lVar5);
      if ((long)uVar7 < (long)this->finest_amr_lev) {
        pVVar2 = (this->res).
                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar1 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar3 = (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (*this->linop->_vptr_MLLinOp[0x36])
                  (this->linop,uVar7 & 0xffffffff,
                   *(undefined8 *)
                    ((long)&(pVVar2->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6),
                   (long)&(pAVar1->m_ptr)._M_t.
                          super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                   lVar8,(long)&(pAVar3->m_ptr)._M_t.
                                super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + lVar8,
                   *(undefined8 *)
                    ((long)&pVVar2[1].super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar6),
                   (long)&pAVar1[1].m_ptr._M_t.
                          super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                   lVar8,(long)&pAVar3[1].m_ptr._M_t.
                                super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + lVar8);
      }
      lVar6 = lVar6 + -0x18;
      lVar8 = lVar8 + -8;
      bVar4 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

void
MLMG::computeMLResidual (int amrlevmax)
{
    BL_PROFILE("MLMG::computeMLResidual()");

    const int mglev = 0;
    for (int alev = amrlevmax; alev >= 0; --alev) {
        const Any* crse_bcdata = (alev > 0) ? &(sol[alev-1]) : nullptr;
        linop.AnySolutionResidual(alev, res[alev][mglev], sol[alev], rhs[alev], crse_bcdata);
        if (alev < finest_amr_lev) {
            linop.AnyReflux(alev, res[alev][mglev], sol[alev], rhs[alev],
                            res[alev+1][mglev], sol[alev+1], rhs[alev+1]);
        }
    }
}